

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_is_before(xml_node_struct *ln,xml_node_struct *rn)

{
  xml_node_struct *in_RSI;
  xml_node_struct *in_RDI;
  bool bVar1;
  bool left_higher;
  xml_node_struct *rp;
  xml_node_struct *lp;
  xml_node_struct *local_28;
  xml_node_struct *local_20;
  xml_node_struct *local_18;
  xml_node_struct *local_10;
  bool local_1;
  
  local_28 = in_RSI;
  local_20 = in_RDI;
  while( true ) {
    bVar1 = false;
    if ((local_20 != (xml_node_struct *)0x0) && (bVar1 = false, local_28 != (xml_node_struct *)0x0))
    {
      bVar1 = local_20->parent != local_28->parent;
    }
    if (!bVar1) break;
    local_20 = local_20->parent;
    local_28 = local_28->parent;
  }
  if ((local_20 == (xml_node_struct *)0x0) || (local_28 == (xml_node_struct *)0x0)) {
    local_1 = (bool)((local_20 != (xml_node_struct *)0x0 ^ 0xffU) & 1);
    local_10 = in_RDI;
    for (; local_18 = in_RSI, local_20 != (xml_node_struct *)0x0; local_20 = local_20->parent) {
      local_10 = local_10->parent;
    }
    for (; local_28 != (xml_node_struct *)0x0; local_28 = local_28->parent) {
      local_18 = local_18->parent;
    }
    if (local_10 != local_18) {
      for (; local_10->parent != local_18->parent; local_10 = local_10->parent) {
        local_18 = local_18->parent;
      }
      local_1 = node_is_before_sibling(local_10,local_18);
    }
  }
  else {
    local_1 = node_is_before_sibling(local_20,local_28);
  }
  return local_1;
}

Assistant:

PUGI__FN bool node_is_before(xml_node_struct* ln, xml_node_struct* rn)
	{
		// find common ancestor at the same depth, if any
		xml_node_struct* lp = ln;
		xml_node_struct* rp = rn;

		while (lp && rp && lp->parent != rp->parent)
		{
			lp = lp->parent;
			rp = rp->parent;
		}

		// parents are the same!
		if (lp && rp) return node_is_before_sibling(lp, rp);

		// nodes are at different depths, need to normalize heights
		bool left_higher = !lp;

		while (lp)
		{
			lp = lp->parent;
			ln = ln->parent;
		}

		while (rp)
		{
			rp = rp->parent;
			rn = rn->parent;
		}

		// one node is the ancestor of the other
		if (ln == rn) return left_higher;

		// find common ancestor... again
		while (ln->parent != rn->parent)
		{
			ln = ln->parent;
			rn = rn->parent;
		}

		return node_is_before_sibling(ln, rn);
	}